

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::AddUnityBuild(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer pUVar7;
  bool bVar8;
  int iVar9;
  _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_> _Var10;
  string *psVar11;
  cmValue cVar12;
  cmListFileBacktrace *backtrace;
  cmValue cVar13;
  long *plVar14;
  cmSourceFile *pcVar15;
  long lVar16;
  _Alloc_hider *p_Var17;
  pointer pUVar18;
  pointer ppcVar19;
  _Base_ptr p_Var20;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  value_type *__x;
  pointer *pppcVar21;
  cmGeneratorTarget *this_00;
  undefined7 uVar22;
  pointer ppcVar23;
  UnitySource *file;
  bool bVar24;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_bool> pVar25;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  undefined1 local_280 [24];
  long lStack_268;
  cmLocalGenerator *local_260;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> unity_files;
  string local_240;
  value_type entry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined4 local_1fc;
  cmSourceFile *sf;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  unitySources;
  string local_1c0;
  string local_1a0;
  size_t local_180;
  cmValue local_178;
  cmValue local_170;
  cmGeneratorTarget *local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Alloc_hider local_138;
  long lStack_130;
  string lang;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  filtered_sources;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string filename_base;
  pointer local_70;
  char *local_68;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  
  pppcVar21 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppcVar21;
  local_260 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)&sources);
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppcVar21) {
    operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (bVar8) {
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,local_260->Makefile,IncludeEmptyConfig);
    p_Var1 = &index._M_t._M_impl.super__Rb_tree_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_240._M_dataplus._M_p = (char *)0x0;
    local_168 = target;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles
                  (local_168,&sources,
                   configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)local_240._M_dataplus._M_p);
        ppcVar19 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar23 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppcVar23 != ppcVar19;
            ppcVar23 = ppcVar23 + 1) {
          sf = *ppcVar23;
          p_Var20 = &p_Var1->_M_header;
          for (p_Var2 = index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[*(cmSourceFile **)(p_Var2 + 1) < sf]) {
            if (*(cmSourceFile **)(p_Var2 + 1) >= sf) {
              p_Var20 = p_Var2;
            }
          }
          _Var10._M_node = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var20 != p_Var1) &&
             (_Var10._M_node = p_Var20, sf < *(cmSourceFile **)(p_Var20 + 1))) {
            _Var10._M_node = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)_Var10._M_node == p_Var1) {
            std::
            vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
            ::emplace_back<cmSourceFile*&>
                      ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                        *)&unitySources,&sf);
            entry.second = ((long)unitySources.
                                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)unitySources.
                                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
            entry.first = sf;
            pVar25 = std::
                     _Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                     ::_M_emplace_unique<std::pair<cmSourceFile_const*const,unsigned_long>&>
                               ((_Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                                 *)&index,&entry);
            _Var10 = pVar25.first._M_node;
          }
          p_Var2 = _Var10._M_node[1]._M_parent;
          __position._M_current =
               unitySources.
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              unitySources.
              super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                       &unitySources.
                        super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs,__position,
                       (unsigned_long *)&local_240);
          }
          else {
            *__position._M_current = (unsigned_long)local_240._M_dataplus._M_p;
            unitySources.
            super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_240._M_dataplus._M_p = local_240._M_dataplus._M_p + 1;
      } while (local_240._M_dataplus._M_p <
               (char *)((long)configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)configs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    this_00 = local_168;
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)&sources,&(local_260->super_cmOutputConverter).StateSnapshot);
    psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&sources);
    ppcVar19 = (pointer)(psVar11->_M_dataplus)._M_p;
    ppcVar23 = (pointer)psVar11->_M_string_length;
    cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    pppcVar21 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xc;
    views._M_len = 4;
    views._M_array = (iterator)&sources;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppcVar23;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar19;
    cmCatViews_abi_cxx11_(&filename_base,views);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD_BATCH_SIZE","");
    cVar12 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar21) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (cVar12.Value == (string *)0x0) {
      local_180 = 0;
    }
    else {
      iVar9 = atoi(((cVar12.Value)->_M_dataplus)._M_p);
      local_180 = (size_t)iVar9;
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar21;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sources,"UNITY_BUILD_CODE_BEFORE_INCLUDE","");
    local_170 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar21) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar21;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sources,"UNITY_BUILD_CODE_AFTER_INCLUDE","");
    local_178 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar21) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar21;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD_MODE","");
    cVar12 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar21) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_70 = (pointer)0x779f09;
    local_68 = "CXX";
    backtrace = &local_260->DirectoryBacktrace;
    lVar16 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lang,*(char **)((long)&local_70 + lVar16),(allocator<char> *)&sources);
      pUVar7 = unitySources.
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (__x = unitySources.
                 super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pUVar7; __x = __x + 1) {
        pcVar15 = __x->Source;
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&sources,pcVar15);
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish == (pointer)lang._M_string_length) {
          uVar22 = (undefined7)((ulong)this_00 >> 8);
          if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish == (pointer)0x0) {
            local_1fc = (undefined4)CONCAT71(uVar22,1);
          }
          else {
            iVar9 = bcmp(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,lang._M_dataplus._M_p,
                         (size_t)sources.
                                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            local_1fc = (undefined4)CONCAT71(uVar22,iVar9 == 0);
          }
        }
        else {
          local_1fc = 0;
        }
        if ((char)local_1fc == '\0') {
LAB_002890d0:
          bVar8 = false;
LAB_002890d3:
          bVar6 = false;
LAB_002890d9:
          bVar5 = false;
LAB_002890db:
          bVar4 = false;
LAB_002890dd:
          bVar3 = false;
          bVar24 = false;
        }
        else {
          entry.first = (cmSourceFile *)&local_210;
          local_280._0_8_ = (pointer)0x1a;
          entry.first = (cmSourceFile *)
                        std::__cxx11::string::_M_create((ulong *)&entry,(ulong)local_280);
          local_210._M_allocated_capacity = local_280._0_8_;
          *(undefined8 *)&((entry.first)->Location).field_0xa = 0x495f444c4955425f;
          builtin_strncpy((char *)((long)&((entry.first)->Location).Directory._M_dataplus._M_p + 2),
                          "NCLUSION",8);
          ((entry.first)->Location).Makefile = (cmMakefile *)0x494e555f50494b53;
          ((entry.first)->Location).AmbiguousDirectory = true;
          ((entry.first)->Location).AmbiguousExtension = true;
          ((entry.first)->Location).field_0xa = '_';
          ((entry.first)->Location).field_0xb = 'B';
          ((entry.first)->Location).field_0xc = 'U';
          ((entry.first)->Location).field_0xd = 'I';
          ((entry.first)->Location).field_0xe = 'L';
          ((entry.first)->Location).field_0xf = 'D';
          entry.second = local_280._0_8_;
          *(undefined1 *)
           ((long)&((entry.first)->Location).Makefile +
           (long)&((string *)local_280._0_8_)->_M_dataplus) = 0;
          bVar8 = cmSourceFile::GetPropertyAsBool(pcVar15,(string *)&entry);
          if (bVar8) goto LAB_002890d0;
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          local_280._0_8_ = (pointer)0x10;
          local_240._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_240,(ulong)local_280);
          local_240.field_2._M_allocated_capacity = local_280._0_8_;
          builtin_strncpy(local_240._M_dataplus._M_p,"HEADER_FILE_ONLY",0x10);
          local_240._M_string_length = local_280._0_8_;
          local_240._M_dataplus._M_p[local_280._0_8_] = '\0';
          bVar8 = cmSourceFile::GetPropertyAsBool(pcVar15,&local_240);
          if (bVar8) {
            bVar8 = true;
            goto LAB_002890d3;
          }
          sf = (cmSourceFile *)&local_1e8;
          local_1e8._8_7_ = 0x534e4f4954504f;
          local_1e8._0_7_ = 0x454c49504d4f43;
          local_1e8._M_local_buf[7] = '_';
          local_1f0 = 0xf;
          local_1e8._M_local_buf[0xf] = '\0';
          cVar13 = cmSourceFile::GetProperty(pcVar15,(string *)&sf);
          if (cVar13.Value != (string *)0x0) {
            bVar8 = true;
            bVar6 = true;
            goto LAB_002890d9;
          }
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          local_280._0_8_ = (pointer)0x13;
          local_1a0._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a0,(ulong)local_280);
          local_1a0.field_2._M_allocated_capacity = local_280._0_8_;
          builtin_strncpy(local_1a0._M_dataplus._M_p,"COMPILE_DEFINITIONS",0x13);
          local_1a0._M_string_length = local_280._0_8_;
          local_1a0._M_dataplus._M_p[local_280._0_8_] = '\0';
          cVar13 = cmSourceFile::GetProperty(pcVar15,&local_1a0);
          if (cVar13.Value != (string *)0x0) {
            bVar8 = true;
            bVar6 = true;
            bVar5 = true;
            goto LAB_002890db;
          }
          local_108._M_allocated_capacity = (size_type)&local_f8;
          local_f8._8_5_ = 0x5347414c46;
          local_f8._M_allocated_capacity._0_5_ = 0x49504d4f43;
          local_f8._M_allocated_capacity._5_3_ = 0x5f454c;
          local_108._8_8_ = 0xd;
          local_f8._M_local_buf[0xd] = '\0';
          cVar13 = cmSourceFile::GetProperty(pcVar15,(string *)&local_108);
          if (cVar13.Value != (string *)0x0) {
            bVar8 = true;
            bVar6 = true;
            bVar5 = true;
            bVar4 = true;
            goto LAB_002890dd;
          }
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          local_280._0_8_ = (pointer)0x13;
          local_1c0._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_1c0,(ulong)local_280);
          local_1c0.field_2._M_allocated_capacity = local_280._0_8_;
          *(undefined8 *)local_1c0._M_dataplus._M_p = 0x5f4544554c434e49;
          *(undefined8 *)((long)local_1c0._M_dataplus._M_p + 8) = 0x524f544345524944;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p + 0xf) = 'R';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p + 0x10) = 'I';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p + 0x11) = 'E';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._M_dataplus._M_p + 0x12) = 'S';
          local_1c0._M_string_length = local_280._0_8_;
          local_1c0._M_dataplus._M_p[local_280._0_8_] = '\0';
          cVar13 = cmSourceFile::GetProperty(pcVar15,&local_1c0);
          bVar24 = cVar13.Value == (string *)0x0;
          bVar8 = true;
          bVar6 = true;
          bVar5 = true;
          bVar4 = true;
          bVar3 = true;
        }
        if ((bVar3) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2)) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
        if ((bVar4) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._0_8_ != &local_f8)) {
          operator_delete((void *)local_108._0_8_,
                          CONCAT35(local_f8._M_allocated_capacity._5_3_,
                                   local_f8._M_allocated_capacity._0_5_) + 1);
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2)) {
          operator_delete(local_1a0._M_dataplus._M_p,
                          (ulong)(local_1a0.field_2._M_allocated_capacity + 1));
        }
        if ((bVar6) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sf != &local_1e8)) {
          operator_delete(sf,CONCAT17(local_1e8._M_local_buf[7],local_1e8._0_7_) + 1);
        }
        this_00 = local_168;
        if ((bVar8) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2)) {
          operator_delete(local_240._M_dataplus._M_p,
                          (ulong)(local_240.field_2._M_allocated_capacity + 1));
        }
        if (((char)local_1fc != '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)entry.first != &local_210)) {
          operator_delete(entry.first,(ulong)(local_210._M_allocated_capacity + 1));
        }
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (bVar24) {
          std::
          vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ::push_back(&filtered_sources,__x);
        }
      }
      pppcVar21 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((cVar12.Value == (string *)0x0) ||
         (iVar9 = std::__cxx11::string::compare((char *)cVar12.Value), iVar9 == 0)) {
        AddUnityFilesModeAuto
                  ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                    *)local_280,local_260,this_00,&lang,&configs,&filtered_sources,local_170,
                   local_178,&filename_base,local_180);
LAB_00289596:
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)unity_files.
                      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)unity_files.
                      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)unity_files.
                      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        unity_files.
        super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_280._0_8_;
        unity_files.
        super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_280._8_8_;
        unity_files.
        super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_280._16_8_;
        local_280._0_8_ = (pointer)0x0;
        local_280._8_8_ = (pointer)0x0;
        local_280._16_8_ = (pointer)0x0;
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 *)&sources);
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 *)local_280);
        cVar13.Value = &(unity_files.
                         super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Path;
        pUVar18 = unity_files.
                  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)cVar12.Value);
        if (iVar9 == 0) {
          AddUnityFilesModeGroup
                    ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      *)local_280,local_260,this_00,&lang,&configs,&filtered_sources,local_170,
                     local_178,&filename_base);
          goto LAB_00289596;
        }
        std::operator+(&local_b0,"Invalid UNITY_BUILD_MODE value of ",cVar12.Value);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_b0);
        p_Var17 = (_Alloc_hider *)(plVar14 + 2);
        if ((_Alloc_hider *)*plVar14 == p_Var17) {
          local_138._M_p = p_Var17->_M_p;
          lStack_130 = plVar14[3];
          local_148._M_allocated_capacity = (size_type)&local_138;
        }
        else {
          local_138._M_p = p_Var17->_M_p;
          local_148._M_allocated_capacity = (size_type)(_Alloc_hider *)*plVar14;
        }
        local_148._8_8_ = plVar14[1];
        *plVar14 = (long)p_Var17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    (local_148._M_local_buf,(ulong)(psVar11->_M_dataplus)._M_p);
        local_280._0_8_ = local_280 + 0x10;
        pUVar18 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pUVar18) {
          local_280._16_8_ = (pUVar18->Path)._M_dataplus._M_p;
          lStack_268 = plVar14[3];
        }
        else {
          local_280._16_8_ = (pUVar18->Path)._M_dataplus._M_p;
          local_280._0_8_ = (pointer)*plVar14;
        }
        local_280._8_8_ = plVar14[1];
        *plVar14 = (long)pUVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_280);
        ppcVar19 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == ppcVar19) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar19;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppcVar21;
        }
        else {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar19;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)ppcVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((pointer)local_280._0_8_ != (pointer)(local_280 + 0x10)) {
          operator_delete((void *)local_280._0_8_,
                          (ulong)((long)&(((string *)local_280._16_8_)->_M_dataplus)._M_p + 1));
        }
        if ((_Alloc_hider *)local_148._0_8_ != &local_138) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_138._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        cmake::IssueMessage(local_260->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)&sources
                            ,backtrace);
        cVar13.Value = &(unity_files.
                         super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Path;
        pUVar18 = unity_files.
                  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar21) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          cVar13.Value = &(unity_files.
                           super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Path;
          pUVar18 = unity_files.
                    super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; (pointer)cVar13.Value != pUVar18;
          cVar13.Value = (string *)&cVar13.Value[1]._M_string_length) {
        pcVar15 = cmMakefile::GetOrCreateSource(local_260->Makefile,cVar13.Value,false,Ambiguous);
        cmGeneratorTarget::AddSource(this_00,cVar13.Value,true);
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar21;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sources,"SKIP_UNITY_BUILD_INCLUSION","");
        cmSourceFile::SetProperty(pcVar15,(string *)&sources,"ON");
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar21) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_SOURCE_FILE","");
        cmSourceFile::SetProperty(pcVar15,(string *)&sources,cVar13);
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar21) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (*(char *)&cVar13.Value[1]._M_dataplus._M_p == '\x01') {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppcVar21;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sources,"COMPILE_DEFINITIONS","");
          cmSourceFile::SetProperty
                    (pcVar15,(string *)&sources,"CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
          if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppcVar21) {
            operator_delete(sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)sources.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
      }
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      ~vector(&unity_files);
      std::
      vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ::~vector(&filtered_sources);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lang._M_dataplus._M_p != &lang.field_2) {
        operator_delete(lang._M_dataplus._M_p,lang.field_2._M_allocated_capacity + 1);
      }
      lVar16 = lVar16 + 8;
    } while (lVar16 != 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename_base._M_dataplus._M_p != &filename_base.field_2) {
      operator_delete(filename_base._M_dataplus._M_p,filename_base.field_2._M_allocated_capacity + 1
                     );
    }
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::
    vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ::~vector(&unitySources);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddUnityBuild(cmGeneratorTarget* target)
{
  if (!target->GetPropertyAsBool("UNITY_BUILD")) {
    return;
  }

  std::vector<UnityBatchedSource> unitySources;

  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    // FIXME: Refactor collection of sources to not evaluate object libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, configs[ci]);
    for (cmSourceFile* sf : sources) {
      auto mi = index.find(sf);
      if (mi == index.end()) {
        unitySources.emplace_back(sf);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          sf, unitySources.size() - 1);
        mi = index.insert(entry).first;
      }
      unitySources[mi->second].Configs.emplace_back(ci);
    }
  }

  std::string filename_base =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/",
             target->GetName(), ".dir/Unity/");

  cmValue batchSizeString = target->GetProperty("UNITY_BUILD_BATCH_SIZE");
  const size_t unityBatchSize = batchSizeString
    ? static_cast<size_t>(std::atoi(batchSizeString->c_str()))
    : 0;

  cmValue beforeInclude =
    target->GetProperty("UNITY_BUILD_CODE_BEFORE_INCLUDE");
  cmValue afterInclude = target->GetProperty("UNITY_BUILD_CODE_AFTER_INCLUDE");
  cmValue unityMode = target->GetProperty("UNITY_BUILD_MODE");

  for (std::string lang : { "C", "CXX" }) {
    std::vector<UnityBatchedSource> filtered_sources;
    std::copy_if(unitySources.begin(), unitySources.end(),
                 std::back_inserter(filtered_sources),
                 [&](UnityBatchedSource const& ubs) -> bool {
                   cmSourceFile* sf = ubs.Source;
                   return sf->GetLanguage() == lang &&
                     !sf->GetPropertyAsBool("SKIP_UNITY_BUILD_INCLUSION") &&
                     !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
                     !sf->GetProperty("COMPILE_OPTIONS") &&
                     !sf->GetProperty("COMPILE_DEFINITIONS") &&
                     !sf->GetProperty("COMPILE_FLAGS") &&
                     !sf->GetProperty("INCLUDE_DIRECTORIES");
                 });

    std::vector<UnitySource> unity_files;
    if (!unityMode || *unityMode == "BATCH") {
      unity_files = AddUnityFilesModeAuto(
        target, lang, configs, filtered_sources, beforeInclude, afterInclude,
        filename_base, unityBatchSize);
    } else if (unityMode && *unityMode == "GROUP") {
      unity_files =
        AddUnityFilesModeGroup(target, lang, configs, filtered_sources,
                               beforeInclude, afterInclude, filename_base);
    } else {
      // unity mode is set to an unsupported value
      std::string e("Invalid UNITY_BUILD_MODE value of " + *unityMode +
                    " assigned to target " + target->GetName() +
                    ". Acceptable values are BATCH and GROUP.");
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }

    for (UnitySource const& file : unity_files) {
      auto* unity = this->GetMakefile()->GetOrCreateSource(file.Path);
      target->AddSource(file.Path, true);
      unity->SetProperty("SKIP_UNITY_BUILD_INCLUSION", "ON");
      unity->SetProperty("UNITY_SOURCE_FILE", file.Path);
      if (file.PerConfig) {
        unity->SetProperty("COMPILE_DEFINITIONS",
                           "CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
      }
    }
  }
}